

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> * __thiscall
bssl::InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator=
          (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this,
          InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *other)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  
  Shrink(this,0);
  bVar2 = other->size_;
  if ((ulong)bVar2 != 0) {
    lVar3 = 0;
    do {
      pcVar1 = other->storage_ + lVar3;
      *(undefined8 *)(this->storage_ + lVar3) = *(undefined8 *)pcVar1;
      *(undefined8 *)(this->storage_ + lVar3 + 8) = *(undefined8 *)(pcVar1 + 8);
      *(undefined8 *)(this->storage_ + lVar3 + 0x10) = *(undefined8 *)(pcVar1 + 0x10);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pcVar1[0x10] = '\0';
      pcVar1[0x11] = '\0';
      pcVar1[0x12] = '\0';
      pcVar1[0x13] = '\0';
      pcVar1[0x14] = '\0';
      pcVar1[0x15] = '\0';
      pcVar1[0x16] = '\0';
      pcVar1[0x17] = '\0';
      lVar3 = lVar3 + 0x18;
    } while (pcVar1 + 0x18 != other->storage_ + (ulong)bVar2 * 0x18);
  }
  this->size_ = other->size_;
  return this;
}

Assistant:

InplaceVector &operator=(InplaceVector &&other) {
    clear();
    std::uninitialized_move(other.begin(), other.end(), data());
    size_ = other.size();
    return *this;
  }